

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamGenerator<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>_> __thiscall
testing::internal::CartesianProductHolder::operator_cast_to_ParamGenerator
          (CartesianProductHolder *this)

{
  CartesianProductGenerator<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Tuple_impl<0UL,_testing::internal::ValueArray<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>,_testing::internal::ParamGenerator<int>_>
  *in_RSI;
  ParamGenerator<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>_> PVar1;
  _Tuple_impl<0UL,_testing::internal::ParamGenerator<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>,_testing::internal::ParamGenerator<int>_>
  local_40;
  
  this_00 = (CartesianProductGenerator<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int> *)
            operator_new(0x28);
  std::
  _Tuple_impl<0ul,testing::internal::ParamGenerator<void(*)(int_const*,int,int,unsigned_char*)>,testing::internal::ParamGenerator<int>>
  ::
  _Tuple_impl<testing::internal::ValueArray<void(*)(int_const*,int,int,unsigned_char*)>,testing::internal::ParamGenerator<int>>
            ((_Tuple_impl<0ul,testing::internal::ParamGenerator<void(*)(int_const*,int,int,unsigned_char*)>,testing::internal::ParamGenerator<int>>
              *)&local_40,in_RSI);
  CartesianProductGenerator<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>::
  CartesianProductGenerator
            (this_00,(tuple<testing::internal::ParamGenerator<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>,_testing::internal::ParamGenerator<int>_>
                      *)&local_40);
  std::
  __shared_ptr<testing::internal::ParamGeneratorInterface<std::tuple<void(*)(int_const*,int,int,unsigned_char*),int>>const,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<testing::internal::ParamGeneratorInterface<std::tuple<void(*)(int_const*,int,int,unsigned_char*),int>>,void>
            ((__shared_ptr<testing::internal::ParamGeneratorInterface<std::tuple<void(*)(int_const*,int,int,unsigned_char*),int>>const,(__gnu_cxx::_Lock_policy)2>
              *)this,(ParamGeneratorInterface<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>_>
                      *)this_00);
  std::
  _Tuple_impl<0UL,_testing::internal::ParamGenerator<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>,_testing::internal::ParamGenerator<int>_>
  ::~_Tuple_impl(&local_40);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>_>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<::std::tuple<T...>>() const {
    return ParamGenerator<::std::tuple<T...>>(
        new CartesianProductGenerator<T...>(generators_));
  }